

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O1

bool __thiscall
chrono::geometry::ChTriangleMeshConnected::LoadWavefrontMesh
          (ChTriangleMeshConnected *this,string *filename,bool load_normals,bool load_uv)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  pointer piVar4;
  bool bVar5;
  mesh_t *pmVar6;
  ostream *poVar7;
  undefined7 in_register_00000009;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ChVector<double> local_168;
  vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *local_150;
  string err;
  string warn;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  attrib_t att;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  
  filesystem::path::path((path *)&att,filename);
  bVar5 = filesystem::path::is_file((path *)&att);
  if (!bVar5) {
    __assert_fail("filesystem::path(filename).is_file()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/geometry/ChTriangleMeshConnected.cpp"
                  ,0xf1,
                  "bool chrono::geometry::ChTriangleMeshConnected::LoadWavefrontMesh(const std::string &, bool, bool)"
                 );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish);
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  warn._M_dataplus._M_p = (pointer)&warn.field_2;
  warn._M_string_length = 0;
  warn.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  bVar5 = tinyobj::LoadObj(&att,&shapes,&materials,&warn,&err,(filename->_M_dataplus)._M_p,
                           (char *)0x0,true,true);
  if (bVar5) {
    pCVar1 = (this->m_vertices).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vertices).
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish != pCVar1) {
      (this->m_vertices).
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = pCVar1;
    }
    pCVar1 = (this->m_normals).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_normals).
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish != pCVar1) {
      (this->m_normals).
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = pCVar1;
    }
    pCVar2 = (this->m_UV).
             super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_UV).
        super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
        _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
      (this->m_UV).
      super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = pCVar2;
    }
    pCVar3 = (this->m_face_v_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_face_v_indices).
        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar3) {
      (this->m_face_v_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar3;
    }
    pCVar3 = (this->m_face_n_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_face_n_indices).
        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar3) {
      (this->m_face_n_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar3;
    }
    pCVar3 = (this->m_face_uv_indices).
             super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_face_uv_indices).
        super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar3) {
      (this->m_face_uv_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = pCVar3;
    }
    std::__cxx11::string::_M_assign((string *)&this->m_filename);
    local_150 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                CONCAT44(local_150._4_4_,(int)CONCAT71(in_register_00000009,load_uv));
    if (8 < (ulong)((long)att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      lVar8 = 8;
      uVar9 = 0;
      do {
        local_168.m_data[0] =
             (double)*(float *)((long)att.vertices.super__Vector_base<float,_std::allocator<float>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar8 + -8);
        local_168.m_data[1] =
             (double)*(float *)((long)att.vertices.super__Vector_base<float,_std::allocator<float>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar8 + -4);
        local_168.m_data[2] =
             (double)*(float *)((long)att.vertices.super__Vector_base<float,_std::allocator<float>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar8);
        std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
        emplace_back<chrono::ChVector<double>>
                  ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                   &this->m_vertices,&local_168);
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0xc;
      } while (uVar9 < (ulong)((long)att.vertices.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 2) / 3);
    }
    if ((load_normals) &&
       (8 < (ulong)((long)att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start))) {
      lVar8 = 8;
      uVar9 = 0;
      do {
        local_168.m_data[0] =
             (double)*(float *)((long)att.normals.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar8 + -8);
        local_168.m_data[1] =
             (double)*(float *)((long)att.normals.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar8 + -4);
        local_168.m_data[2] =
             (double)*(float *)((long)att.normals.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar8);
        std::vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>>::
        emplace_back<chrono::ChVector<double>>
                  ((vector<chrono::ChVector<double>,std::allocator<chrono::ChVector<double>>> *)
                   &this->m_normals,&local_168);
        uVar9 = uVar9 + 1;
        lVar8 = lVar8 + 0xc;
      } while (uVar9 < (ulong)((long)att.normals.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)att.normals.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 2) / 3);
    }
    if (((char)local_150 != '\0') &&
       (4 < (ulong)((long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start))) {
      uVar9 = 0;
      do {
        local_168.m_data[0] =
             (double)att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9 * 2];
        local_168.m_data[1] =
             (double)att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9 * 2 + 1];
        std::vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>>::
        emplace_back<chrono::ChVector2<double>>
                  ((vector<chrono::ChVector2<double>,std::allocator<chrono::ChVector2<double>>> *)
                   &this->m_UV,(ChVector2<double> *)&local_168);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2) >> 1);
    }
    if (shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_150 = (vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                  &this->m_face_n_indices;
      uVar9 = 0;
      do {
        if (2 < (ulong)(((long)shapes.
                               super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar9].mesh.indices.
                               super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)shapes.
                               super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar9].mesh.indices.
                               super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555
                       )) {
          pmVar6 = &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar9].mesh;
          lVar8 = 0;
          uVar10 = 0;
          do {
            piVar4 = (pmVar6->indices).
                     super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
                     .super__Vector_impl_data._M_start;
            local_168.m_data[0] =
                 (double)CONCAT44(*(undefined4 *)((long)(piVar4 + 1) + lVar8),
                                  *(undefined4 *)((long)&piVar4->vertex_index + lVar8));
            local_168.m_data[1] =
                 (double)CONCAT44(local_168.m_data[1]._4_4_,
                                  *(undefined4 *)((long)(piVar4 + 2) + lVar8));
            std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
            emplace_back<chrono::ChVector<int>>
                      ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                       &this->m_face_v_indices,(ChVector<int> *)&local_168);
            if ((this->m_normals).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (this->m_normals).
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              piVar4 = shapes.
                       super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar9].mesh.indices.
                       super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              local_168.m_data[0] =
                   (double)CONCAT44(*(undefined4 *)((long)(piVar4 + 1) + 4U + lVar8),
                                    *(undefined4 *)((long)&piVar4->normal_index + lVar8));
              local_168.m_data[1] =
                   (double)CONCAT44(local_168.m_data[1]._4_4_,
                                    *(undefined4 *)((long)(piVar4 + 2) + 4U + lVar8));
              std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
              emplace_back<chrono::ChVector<int>>(local_150,(ChVector<int> *)&local_168);
            }
            if ((this->m_UV).
                super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (this->m_UV).
                super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              piVar4 = shapes.
                       super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar9].mesh.indices.
                       super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              local_168.m_data[0] =
                   (double)CONCAT44(*(undefined4 *)((long)(piVar4 + 1) + 8U + lVar8),
                                    *(undefined4 *)((long)&piVar4->texcoord_index + lVar8));
              local_168.m_data[1] =
                   (double)CONCAT44(local_168.m_data[1]._4_4_,
                                    *(undefined4 *)((long)(piVar4 + 2) + 8U + lVar8));
              std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
              emplace_back<chrono::ChVector<int>>
                        ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
                         &this->m_face_uv_indices,(ChVector<int> *)&local_168);
            }
            uVar10 = uVar10 + 1;
            pmVar6 = &shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar9].mesh;
            lVar8 = lVar8 + 0x24;
          } while (uVar10 < (ulong)(((long)(pmVar6->indices).
                                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pmVar6->indices).
                                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                   -0x5555555555555555) / 3);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)(((long)shapes.
                                      super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)shapes.
                                      super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5) *
                              0x6db6db6db6db6db7));
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error loading OBJ file ",0x17);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"   tiny_obj warning message: ",0x1d);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,warn._M_dataplus._M_p,warn._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"   tiny_obj error message:   ",0x1d);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,err._M_dataplus._M_p,err._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)err._M_dataplus._M_p != &err.field_2) {
    operator_delete(err._M_dataplus._M_p,
                    CONCAT71(err.field_2._M_allocated_capacity._1_7_,err.field_2._M_local_buf[0]) +
                    1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)warn._M_dataplus._M_p != &warn.field_2) {
    operator_delete(warn._M_dataplus._M_p,
                    CONCAT71(warn.field_2._M_allocated_capacity._1_7_,warn.field_2._M_local_buf[0])
                    + 1);
  }
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
  if (att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)att.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)att.texcoord_ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)att.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)att.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)att.vertex_weights.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)att.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
  return bVar5;
}

Assistant:

bool ChTriangleMeshConnected::LoadWavefrontMesh(const std::string& filename, bool load_normals, bool load_uv) {
    assert(filesystem::path(filename).is_file());

    std::vector<tinyobj::shape_t> shapes;
    tinyobj::attrib_t att;
    std::vector<tinyobj::material_t> materials;
    std::string warn;
    std::string err;

    bool success = tinyobj::LoadObj(&att, &shapes, &materials, &warn, &err, filename.c_str());
    if (!success) {
        std::cerr << "Error loading OBJ file " << filename << std::endl;
        std::cerr << "   tiny_obj warning message: " << warn << std::endl;
        std::cerr << "   tiny_obj error message:   " << err << std::endl;
        return false;
    }

    m_vertices.clear();
    m_normals.clear();
    m_UV.clear();
    m_face_v_indices.clear();
    m_face_n_indices.clear();
    m_face_uv_indices.clear();

    m_filename = filename;

    for (size_t i = 0; i < att.vertices.size() / 3; i++) {
        m_vertices.push_back(ChVector<>(att.vertices[3 * i + 0], att.vertices[3 * i + 1], att.vertices[3 * i + 2]));
    }
    if (load_normals) {
        for (size_t i = 0; i < att.normals.size() / 3; i++) {
            m_normals.push_back(ChVector<>(att.normals[3 * i + 0], att.normals[3 * i + 1], att.normals[3 * i + 2]));
        }
    }
    if (load_uv) {
        for (size_t i = 0; i < att.texcoords.size() / 2; i++) {
            m_UV.push_back(ChVector2<>(att.texcoords[2 * i + 0], att.texcoords[2 * i + 1]));
        }
    }

    for (size_t i = 0; i < shapes.size(); i++) {
        for (size_t j = 0; j < shapes[i].mesh.indices.size() / 3; j++) {
            m_face_v_indices.push_back(ChVector<int>(shapes[i].mesh.indices[3 * j + 0].vertex_index,
                                                     shapes[i].mesh.indices[3 * j + 1].vertex_index,
                                                     shapes[i].mesh.indices[3 * j + 2].vertex_index));
            if (m_normals.size() > 0) {
                m_face_n_indices.push_back(ChVector<int>(shapes[i].mesh.indices[3 * j + 0].normal_index,
                                                         shapes[i].mesh.indices[3 * j + 1].normal_index,
                                                         shapes[i].mesh.indices[3 * j + 2].normal_index));
            }
            if (m_UV.size() > 0) {
                m_face_uv_indices.push_back(ChVector<int>(shapes[i].mesh.indices[3 * j + 0].texcoord_index,
                                                          shapes[i].mesh.indices[3 * j + 1].texcoord_index,
                                                          shapes[i].mesh.indices[3 * j + 2].texcoord_index));
            }
        }
    }

    return true;
}